

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

void linklist_5_3::test_1(void)

{
  LinkList local_18;
  LinkList a;
  LinkList list;
  
  local_18 = (LinkList)malloc(0x10);
  local_18->data = 0;
  local_18->next = a;
  ps_link_list(a);
  select_order(&local_18);
  ps_link_list(local_18);
  return;
}

Assistant:

void test_1() {
        LinkList list;
        auto a = newNode;
        a->data = 0;
        a->next = list;
        ps_link_list(list);
//        insert(list, 3, 12);
//        int e;
//        del_(list, 4, &e);
//        reverse_order(list);
//        reverse(a);
//        ps_link_list(a);
//        sort_asc(a);
//        sort_desc(a);
//        del_rank_(a, 2, 8);
        select_order(a);
        ps_link_list(a);
    }